

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void bfgs_iter_start<dense_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               dense_parameters *weights)

{
  weight *pwVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  
  *origin = 0;
  pwVar1 = weights->_begin;
  if (pwVar1 != pwVar1 + weights->_weight_mask + 1) {
    uVar2 = weights->_stride_shift;
    lVar4 = 0;
    do {
      lVar3 = ((ulong)(lVar4 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride;
      if (0 < b->m) {
        mem[lVar3 + (*origin + 1) % b->mem_stride] = *(float *)((long)pwVar1 + lVar4);
      }
      mem[lVar3 + *origin % b->mem_stride] = *(float *)((long)pwVar1 + lVar4 + 4);
      *(float *)((long)pwVar1 + lVar4 + 8) =
           -*(float *)((long)pwVar1 + lVar4 + 0xc) * *(float *)((long)pwVar1 + lVar4 + 4);
      *(undefined4 *)((long)pwVar1 + lVar4 + 4) = 0;
      lVar4 = lVar4 + (1L << ((byte)uVar2 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar1 + lVar4) != weights->_begin + weights->_weight_mask + 1);
  }
  *lastj = 0;
  if (all->quiet == false) {
    bfgs_iter_start<dense_parameters>();
  }
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}